

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_ntop.c
# Opt level: O0

char * inet_ntop6(uchar *src,char *dst,size_t size)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  size_t sVar4;
  int local_cc;
  int i;
  unsigned_long words [8];
  long local_80;
  anon_struct_16_2_623adf6f cur;
  anon_struct_16_2_623adf6f best;
  char *tp;
  char tmp [46];
  size_t size_local;
  char *dst_local;
  uchar *src_local;
  
  unique0x100002c6 = size;
  memset(&stack0xffffffffffffff38,0,0x40);
  for (local_cc = 0; local_cc < 0x10; local_cc = local_cc + 1) {
    words[(long)(local_cc / 2) + -1] =
         (long)(int)((uint)src[local_cc] << (('\x01' - (char)(local_cc % 2)) * '\b' & 0x1fU)) |
         words[(long)(local_cc / 2) + -1];
  }
  cur.len = -1;
  local_80 = -1;
  best.base = 0;
  cur.base = 0;
  for (local_cc = 0; local_cc < 8; local_cc = local_cc + 1) {
    if (words[(long)local_cc + -1] == 0) {
      if (local_80 == -1) {
        local_80 = (long)local_cc;
        cur.base = 1;
      }
      else {
        cur.base = cur.base + 1;
      }
    }
    else if (local_80 != -1) {
      if ((cur.len == -1) || (best.base < cur.base)) {
        cur.len = local_80;
        best.base = cur.base;
      }
      local_80 = -1;
    }
  }
  if ((local_80 != -1) && ((cur.len == -1 || (best.base < cur.base)))) {
    cur.len = local_80;
    best.base = cur.base;
  }
  if ((cur.len != -1) && (best.base < 2)) {
    cur.len = -1;
  }
  best.len = (long)&tp;
  local_cc = 0;
  do {
    if (7 < local_cc) {
LAB_0014611f:
      if ((cur.len != -1) && (cur.len + best.base == 8)) {
        *(undefined1 *)best.len = 0x3a;
        best.len = best.len + 1;
      }
      *(undefined1 *)best.len = 0;
      if (stack0xffffffffffffffd8 < (ulong)((best.len + 1) - (long)&tp)) {
        piVar3 = __errno_location();
        *piVar3 = 0x1c;
        src_local = (uchar *)0x0;
      }
      else {
        strcpy(dst,(char *)&tp);
        src_local = (uchar *)dst;
      }
      return (char *)src_local;
    }
    if (((cur.len == -1) || (local_cc < cur.len)) || (cur.len + best.base <= (long)local_cc)) {
      if (local_cc != 0) {
        *(undefined1 *)best.len = 0x3a;
        best.len = best.len + 1;
      }
      if (((local_cc == 6) && (cur.len == 0)) &&
         ((best.base == 6 || ((best.base == 5 && (words[4] == 0xffff)))))) {
        pcVar2 = inet_ntop4(src + 0xc,(char *)best.len,0x2e - (best.len - (long)&tp));
        if (pcVar2 == (char *)0x0) {
          piVar3 = __errno_location();
          *piVar3 = 0x1c;
          return (char *)0x0;
        }
        sVar4 = strlen((char *)best.len);
        best.len = sVar4 + best.len;
        goto LAB_0014611f;
      }
      iVar1 = curl_msnprintf((char *)best.len,5,"%lx",words[(long)local_cc + -1]);
      best.len = best.len + iVar1;
    }
    else if (local_cc == cur.len) {
      *(undefined1 *)best.len = 0x3a;
      best.len = best.len + 1;
    }
    local_cc = local_cc + 1;
  } while( true );
}

Assistant:

static char *inet_ntop6 (const unsigned char *src, char *dst, size_t size)
{
  /*
   * Note that int32_t and int16_t need only be "at least" large enough
   * to contain a value of the specified size.  On some systems, like
   * Crays, there is no such thing as an integer variable with 16 bits.
   * Keep this in mind if you think this function should have been coded
   * to use pointer overlays.  All the world's not a VAX.
   */
  char tmp[sizeof("ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255")];
  char *tp;
  struct {
    long base;
    long len;
  } best, cur;
  unsigned long words[IN6ADDRSZ / INT16SZ];
  int i;

  /* Preprocess:
   *  Copy the input (bytewise) array into a wordwise array.
   *  Find the longest run of 0x00's in src[] for :: shorthanding.
   */
  memset(words, '\0', sizeof(words));
  for(i = 0; i < IN6ADDRSZ; i++)
    words[i/2] |= (src[i] << ((1 - (i % 2)) << 3));

  best.base = -1;
  cur.base  = -1;
  best.len = 0;
  cur.len = 0;

  for(i = 0; i < (IN6ADDRSZ / INT16SZ); i++) {
    if(words[i] == 0) {
      if(cur.base == -1)
        cur.base = i, cur.len = 1;
      else
        cur.len++;
    }
    else if(cur.base != -1) {
      if(best.base == -1 || cur.len > best.len)
        best = cur;
      cur.base = -1;
    }
  }
  if((cur.base != -1) && (best.base == -1 || cur.len > best.len))
    best = cur;
  if(best.base != -1 && best.len < 2)
    best.base = -1;
  /* Format the result. */
  tp = tmp;
  for(i = 0; i < (IN6ADDRSZ / INT16SZ); i++) {
    /* Are we inside the best run of 0x00's? */
    if(best.base != -1 && i >= best.base && i < (best.base + best.len)) {
      if(i == best.base)
        *tp++ = ':';
      continue;
    }

    /* Are we following an initial run of 0x00s or any real hex?
     */
    if(i != 0)
      *tp++ = ':';

    /* Is this address an encapsulated IPv4?
     */
    if(i == 6 && best.base == 0 &&
        (best.len == 6 || (best.len == 5 && words[5] == 0xffff))) {
      if(!inet_ntop4(src + 12, tp, sizeof(tmp) - (tp - tmp))) {
        errno = ENOSPC;
        return (NULL);
      }
      tp += strlen(tp);
      break;
    }
    tp += snprintf(tp, 5, "%lx", words[i]);
  }

  /* Was it a trailing run of 0x00's?
   */
  if(best.base != -1 && (best.base + best.len) == (IN6ADDRSZ / INT16SZ))
     *tp++ = ':';
  *tp++ = '\0';

  /* Check for overflow, copy, and we're done.
   */
  if((size_t)(tp - tmp) > size) {
    errno = ENOSPC;
    return (NULL);
  }
  strcpy(dst, tmp);
  return dst;
}